

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * escapeHtml(QString *__return_storage_ptr__,QString *input)

{
  long lVar1;
  qsizetype qVar2;
  size_t sVar3;
  QLatin1String local_68;
  QString local_58;
  QChar local_3c;
  char16_t local_3a;
  char *pcStack_38;
  ushort ch;
  char *replacement;
  int local_20;
  undefined1 local_19;
  int i;
  QString *input_local;
  QString *escaped;
  
  local_19 = 0;
  _i = input;
  input_local = __return_storage_ptr__;
  QString::QString(__return_storage_ptr__,input);
  local_20 = 0;
  while (lVar1 = (long)local_20, qVar2 = QString::length(__return_storage_ptr__), lVar1 < qVar2) {
    pcStack_38 = (char *)0x0;
    local_3c = QString::at(__return_storage_ptr__,(long)local_20);
    local_3a = QChar::unicode(&local_3c);
    if (local_3a == L'&') {
      pcStack_38 = "&amp;";
    }
    else if (local_3a == L'<') {
      pcStack_38 = "&lt;";
    }
    else if (local_3a == L'>') {
      pcStack_38 = "&gt;";
    }
    else if (local_3a == L'\"') {
      pcStack_38 = "&quot;";
    }
    if (pcStack_38 == (char *)0x0) {
      local_20 = local_20 + 1;
    }
    else {
      lVar1 = (long)local_20;
      QLatin1String::QLatin1String(&local_68,pcStack_38);
      QString::QString(&local_58,local_68);
      QString::replace((longlong)__return_storage_ptr__,lVar1,(QString *)0x1);
      QString::~QString(&local_58);
      sVar3 = strlen(pcStack_38);
      local_20 = (int)sVar3 + local_20;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString escapeHtml(const QString& input)
{
	QString escaped(input);
	for (int i=0; i < escaped.length();) {
		const char* replacement = 0;
		ushort ch = escaped.at(i).unicode();
		if (ch == '&') {
			replacement = "&amp;";
		} else if (ch == '<') {
			replacement = "&lt;";
		} else if (ch == '>') {
			replacement = "&gt;";
		} else if (ch == '"') {
			replacement = "&quot;";
		}
		if (replacement) {
			escaped.replace(i, 1, QLatin1String(replacement));
			i += (int)strlen(replacement);
		} else {
			++i;
		}
	}
	return escaped;
}